

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O2

void __thiscall
opengv::absolute_pose::modules::Epnp::find_betas_approx_3
          (Epnp *this,Matrix<double,_6,_10,_0,_6,_10> *L_6x10,Matrix<double,_6,_1,_0,_6,_1> *Rho,
          double *betas)

{
  double *pdVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  VectorXd b5;
  VectorXd Rho_temp;
  MatrixXd L_6x5;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *local_250;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *local_248;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD;
  
  SVD.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.m_matrixU.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data._0_4_ = 6;
  Rho_temp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data._0_4_ = 5
  ;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&L_6x5,(int *)&SVD,(int *)&Rho_temp);
  for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
    pdVar1 = L_6x5.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
             + lVar5;
    *pdVar1 = (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.
              m_data.array[lVar5];
    pdVar1[L_6x5.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows]
         = (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data
           .array[lVar5 + 6];
    pdVar1[L_6x5.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
           2] = (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.
                m_data.array[lVar5 + 0xc];
    pdVar1[L_6x5.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
           3] = (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.
                m_data.array[lVar5 + 0x12];
    pdVar1[L_6x5.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
           4] = (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.
                m_data.array[lVar5 + 0x18];
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD(&SVD,&L_6x5,0x14);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&Rho_temp,
             (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)Rho);
  local_250 = &SVD;
  local_248 = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&Rho_temp;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Solve<Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_1,_1,0,_1,_1>,2>>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&b5,
             (DenseBase<Eigen::Solve<Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_250);
  dVar10 = *b5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar10;
  if (0.0 <= dVar10) {
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      auVar7 = vsqrtsd_avx(auVar7,auVar7);
      dVar10 = auVar7._0_8_;
    }
    *betas = dVar10;
    dVar10 = 0.0;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = b5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data[2];
    if (b5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[2] <= 0.0
       ) goto LAB_002381dd;
  }
  else {
    auVar11._0_8_ = -dVar10;
    auVar11._8_8_ = 0x8000000000000000;
    if (-0.0 < dVar10) {
      dVar10 = sqrt(auVar11._0_8_);
    }
    else {
      auVar7 = vsqrtsd_avx(auVar11,auVar11);
      dVar10 = auVar7._0_8_;
    }
    *betas = dVar10;
    dVar10 = 0.0;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = b5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data[2];
    if (0.0 <= b5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[2]
       ) goto LAB_002381dd;
    auVar3._8_8_ = 0x8000000000000000;
    auVar3._0_8_ = 0x8000000000000000;
    auVar6 = vxorpd_avx512vl(auVar8,auVar3);
  }
  if (auVar6._0_8_ < 0.0) {
    dVar10 = sqrt(auVar6._0_8_);
  }
  else {
    auVar7 = vsqrtsd_avx(auVar6,auVar6);
    dVar10 = auVar7._0_8_;
  }
LAB_002381dd:
  betas[1] = dVar10;
  dVar10 = *betas;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar10;
  if (b5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[1] < 0.0) {
    auVar4._8_8_ = 0x8000000000000000;
    auVar4._0_8_ = 0x8000000000000000;
    auVar7 = vxorpd_avx512vl(auVar9,auVar4);
    dVar10 = auVar7._0_8_;
    dVar2 = (double)vmovlpd_avx(auVar7);
    *betas = dVar2;
  }
  betas[2] = b5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[3] /
             dVar10;
  betas[3] = 0.0;
  Eigen::internal::handmade_aligned_free
            (b5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            ((void *)CONCAT44(Rho_temp.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data._4_4_,
                              Rho_temp.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data._0_4_));
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&SVD);
  Eigen::internal::handmade_aligned_free
            (L_6x5.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
            );
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::find_betas_approx_3(
    const Eigen::Matrix<double,6,10> & L_6x10,
    const Eigen::Matrix<double,6,1> & Rho,
    double * betas)
{
  Eigen::MatrixXd L_6x5(6,5);

  for(int i = 0; i < 6; i++)
  {
    L_6x5(i,0) = L_6x10(i,0);
    L_6x5(i,1) = L_6x10(i,1);
    L_6x5(i,2) = L_6x10(i,2);
    L_6x5(i,3) = L_6x10(i,3);
    L_6x5(i,4) = L_6x10(i,4);
  }

  Eigen::JacobiSVD<Eigen::MatrixXd> SVD(
      L_6x5,
      Eigen::ComputeFullV | Eigen::ComputeFullU);
  Eigen::VectorXd Rho_temp = Rho;
  Eigen::VectorXd b5 = SVD.solve(Rho_temp);

  if (b5[0] < 0)
  {
    betas[0] = sqrt(-b5[0]);
    betas[1] = (b5[2] < 0) ? sqrt(-b5[2]) : 0.0;
  }
  else
  {
    betas[0] = sqrt(b5[0]);
    betas[1] = (b5[2] > 0) ? sqrt(b5[2]) : 0.0;
  }
  if (b5[1] < 0) betas[0] = -betas[0];
  betas[2] = b5[3] / betas[0];
  betas[3] = 0.0;
}